

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbol(DescriptorBuilder *this,string *name,bool build_it)

{
  _Rb_tree_header *p_Var1;
  pointer file_00;
  undefined1 auVar2 [16];
  bool bVar3;
  FileDescriptor *pFVar4;
  _Base_ptr p_Var5;
  DescriptorBuilder *pDVar6;
  _Base_ptr p_Var7;
  DescriptorBuilder *this_00;
  DescriptorBuilder *pDVar8;
  Symbol SVar9;
  pair<std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>,_std::_Rb_tree_iterator<const_google::protobuf::FileDescriptor_*>_>
  pVar10;
  undefined1 auVar11 [16];
  Symbol result;
  FileDescriptor *file;
  Type local_40;
  anon_union_8_8_13f84498_for_Symbol_2 local_38;
  FileDescriptor *local_30;
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined8 uVar15;
  undefined8 uVar16;
  
  SVar9 = FindSymbolNotEnforcingDepsHelper(this,this->pool_,name,build_it);
  local_38 = SVar9.field_1;
  local_40 = SVar9.type;
  if (local_40 == NULL_SYMBOL) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_38;
    SVar9 = (Symbol)(auVar2 << 0x40);
    auVar11._0_4_ = SVar9.type;
    auVar13._4_4_ = SVar9._4_4_;
    register0x00000010 = SVar9.field_1;
    return (Symbol)auVar11;
  }
  if (this->pool_->enforce_dependencies_ != true) {
    auVar12._0_4_ = SVar9.type;
    auVar14._4_4_ = SVar9._4_4_;
    register0x00000010 = SVar9.field_1;
    return (Symbol)auVar12;
  }
  this_00 = (DescriptorBuilder *)&stack0xffffffffffffffc0;
  pFVar4 = Symbol::GetFile((Symbol *)this_00);
  local_30 = pFVar4;
  if (pFVar4 == this->file_) {
LAB_00571723:
    pVar10 = std::
             _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             ::equal_range(&(this->unused_dependency_)._M_t,&stack0xffffffffffffffd0);
    std::
    _Rb_tree<const_google::protobuf::FileDescriptor_*,_const_google::protobuf::FileDescriptor_*,_std::_Identity<const_google::protobuf::FileDescriptor_*>,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::_M_erase_aux(&(this->unused_dependency_)._M_t,(_Base_ptr)pVar10.first._M_node,
                   (_Base_ptr)pVar10.second._M_node);
LAB_00571742:
    SVar9._4_4_ = 0;
    SVar9.type = local_40;
    SVar9.field_1.descriptor = local_38.descriptor;
  }
  else {
    p_Var5 = (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var1 = &(this->dependencies_)._M_t._M_impl.super__Rb_tree_header;
    p_Var7 = &p_Var1->_M_header;
    if (p_Var5 != (_Base_ptr)0x0) {
      do {
        if (*(FileDescriptor **)(p_Var5 + 1) >= pFVar4) {
          p_Var7 = p_Var5;
        }
        p_Var5 = (&p_Var5->_M_left)[*(FileDescriptor **)(p_Var5 + 1) < pFVar4];
      } while (p_Var5 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var7 != p_Var1) && (*(FileDescriptor **)(p_Var7 + 1) <= pFVar4))
      goto LAB_00571723;
    }
    if (local_40 == PACKAGE) {
      bVar3 = IsInPackage(this_00,this->file_,name);
      if (bVar3) goto LAB_00571742;
      pDVar6 = (DescriptorBuilder *)
               (this->dependencies_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (pDVar8 = pDVar6, pDVar8 != (DescriptorBuilder *)p_Var1) {
        file_00 = (pDVar8->options_to_interpret_).
                  super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        if ((file_00 != (pointer)0x0) &&
           (bVar3 = IsInPackage(this_00,(FileDescriptor *)file_00,name), bVar3)) goto LAB_00571742;
        pDVar6 = (DescriptorBuilder *)std::_Rb_tree_increment((_Rb_tree_node_base *)pDVar8);
        this_00 = pDVar8;
      }
    }
    this->possible_undeclared_dependency_ = pFVar4;
    std::__cxx11::string::_M_assign((string *)&this->possible_undeclared_dependency_name_);
    SVar9 = (Symbol)ZEXT816(0);
  }
  return SVar9;
}

Assistant:

Symbol DescriptorBuilder::FindSymbol(const string& name, bool build_it) {
  Symbol result = FindSymbolNotEnforcingDeps(name, build_it);

  if (result.IsNull()) return result;

  if (!pool_->enforce_dependencies_) {
    // Hack for CompilerUpgrader, and also used for lazily_build_dependencies_
    return result;
  }

  // Only find symbols which were defined in this file or one of its
  // dependencies.
  const FileDescriptor* file = result.GetFile();
  if (file == file_ || dependencies_.count(file) > 0) {
    unused_dependency_.erase(file);
    return result;
  }

  if (result.type == Symbol::PACKAGE) {
    // Arg, this is overcomplicated.  The symbol is a package name.  It could
    // be that the package was defined in multiple files.  result.GetFile()
    // returns the first file we saw that used this package.  We've determined
    // that that file is not a direct dependency of the file we are currently
    // building, but it could be that some other file which *is* a direct
    // dependency also defines the same package.  We can't really rule out this
    // symbol unless none of the dependencies define it.
    if (IsInPackage(file_, name)) return result;
    for (std::set<const FileDescriptor*>::const_iterator it =
             dependencies_.begin();
         it != dependencies_.end(); ++it) {
      // Note:  A dependency may be NULL if it was not found or had errors.
      if (*it != NULL && IsInPackage(*it, name)) return result;
    }
  }

  possible_undeclared_dependency_ = file;
  possible_undeclared_dependency_name_ = name;
  return kNullSymbol;
}